

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int sort(lua_State *L)

{
  undefined4 uVar1;
  int iVar2;
  size_t sVar3;
  lua_State *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  lua_State *in_stack_00000008;
  int n;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  luaL_checktype((lua_State *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  sVar3 = lua_objlen(in_stack_00000008,unaff_retaddr_00);
  uVar1 = (undefined4)sVar3;
  luaL_checkstack((lua_State *)CONCAT44(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
                  (char *)0x11b566);
  iVar2 = lua_type((lua_State *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                   (int)((ulong)in_RDI >> 0x20));
  if (0 < iVar2) {
    luaL_checktype((lua_State *)CONCAT44(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
                   in_stack_ffffffffffffffe8);
  }
  lua_settop(in_RDI,2);
  auxsort((lua_State *)CONCAT44(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
          in_stack_ffffffffffffffe8);
  return 0;
}

Assistant:

static int sort(lua_State*L){
int n=aux_getn(L,1);
luaL_checkstack(L,40,"");
if(!lua_isnoneornil(L,2))
luaL_checktype(L,2,6);
lua_settop(L,2);
auxsort(L,1,n);
return 0;
}